

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

Vec_Int_t * Fra_ClauSaveInputVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf,int nStarting)

{
  Vec_Int_t *p;
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = pMan->nObjs[2] - nStarting;
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar3 = iVar5;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar1;
  pVVar2 = pMan->vCis;
  if (0 < pVVar2->nSize) {
    lVar4 = 0;
    do {
      if (nStarting <= lVar4) {
        Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)pVVar2->pArray[lVar4] + 0x24)]);
      }
      lVar4 = lVar4 + 1;
      pVVar2 = pMan->vCis;
    } while (lVar4 < pVVar2->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveInputVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf, int nStarting )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManCiNum(pMan) - nStarting );
    Aig_ManForEachCi( pMan, pObj, i )
    {
        if ( i < nStarting )
            continue;
        Vec_IntPush( vVars, pCnf->pVarNums[pObj->Id] );
    }
    return vVars;
}